

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

void __thiscall FormatTest_CountCodePoints_Test::TestBody(FormatTest_CountCodePoints_Test *this)

{
  basic_string_view<fmt::v5::char8_t> s;
  undefined1 uVar1;
  AssertHelper *this_00;
  Message *in_RDI;
  AssertHelper *unaff_retaddr;
  AssertionResult gtest_ar;
  char *in_stack_ffffffffffffff78;
  u8string_view *in_stack_ffffffffffffff80;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  Type in_stack_ffffffffffffffac;
  AssertHelper *in_stack_ffffffffffffffb0;
  AssertionResult local_18;
  
  fmt::v5::u8string_view::u8string_view(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  s.data_._4_4_ = in_stack_ffffffffffffff9c;
  s.data_._0_4_ = in_stack_ffffffffffffff98;
  s.size_ = (size_t)in_stack_ffffffffffffffa0;
  fmt::v5::internal::count_code_points(s);
  this_01 = &local_18;
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),(int *)this_01,
             (unsigned_long *)in_stack_ffffffffffffff80);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffb0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x112d75)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff9c,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff90));
    testing::internal::AssertHelper::operator=(unaff_retaddr,in_RDI);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x112dc3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x112e03);
  return;
}

Assistant:

TEST(FormatTest, CountCodePoints) {
  EXPECT_EQ(4, fmt::internal::count_code_points(fmt::u8string_view("ёжик")));
}